

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<unsigned_int,pstore::command_line::parser<unsigned_int,void>>&,char_const(&)[8],pstore::command_line::desc_const&,pstore::command_line::details::initializer<unsigned_int>const&>
               (opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *opt,
               char (*m0) [8],desc *mods,initializer<unsigned_int> *mods_1)

{
  name local_48;
  initializer<unsigned_int> *local_28;
  initializer<unsigned_int> *mods_local_1;
  desc *mods_local;
  char (*m0_local) [8];
  opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *opt_local;
  
  local_28 = mods_1;
  mods_local_1 = (initializer<unsigned_int> *)mods;
  mods_local = (desc *)m0;
  m0_local = (char (*) [8])opt;
  make_modifier(&local_48,*m0);
  name::
  apply<pstore::command_line::opt<unsigned_int,pstore::command_line::parser<unsigned_int,void>>>
            (&local_48,
             (opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *)m0_local);
  name::~name(&local_48);
  apply_to_option<pstore::command_line::opt<unsigned_int,pstore::command_line::parser<unsigned_int,void>>&,pstore::command_line::desc_const&,pstore::command_line::details::initializer<unsigned_int>const&>
            ((opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *)m0_local,
             (desc *)mods_local_1,local_28);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }